

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,REF_GEOM ref_geom_donor)

{
  undefined4 uVar1;
  undefined4 uVar3;
  REF_INT *pRVar2;
  void *pvVar4;
  REF_BOOL RVar5;
  uint uVar6;
  REF_INT *pRVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((ref_geom_recipient->contex_owned != 0) &&
     (uVar6 = ref_egads_close(ref_geom_recipient), uVar6 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbd,
           "ref_geom_share_context",(ulong)uVar6,"close egads contex");
    return uVar6;
  }
  ref_geom_recipient->contex_owned = 0;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  uVar1 = ref_geom_donor->nedge;
  uVar3 = ref_geom_donor->nface;
  ref_geom_recipient->nedge = uVar1;
  ref_geom_recipient->nface = uVar3;
  RVar5 = ref_geom_donor->effective_curvature;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = RVar5;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  pvVar4 = ref_geom_donor->model;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = pvVar4;
  pvVar4 = ref_geom_donor->faces;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = pvVar4;
  pvVar4 = ref_geom_donor->nodes;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = pvVar4;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;
  if (ref_geom_donor->e2f == (REF_INT *)0x0) {
    ref_geom_recipient->e2f = (REF_INT *)0x0;
  }
  else {
    if ((int)uVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2,
             "ref_geom_share_context","malloc ref_geom_recipient->e2f of REF_INT negative");
      return 1;
    }
    uVar6 = uVar1 * 2;
    pRVar7 = (REF_INT *)malloc((ulong)uVar6 * 4);
    ref_geom_recipient->e2f = pRVar7;
    if (pRVar7 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2,
             "ref_geom_share_context","malloc ref_geom_recipient->e2f of REF_INT NULL");
      return 2;
    }
    if (uVar1 != 0) {
      pRVar2 = ref_geom_donor->e2f;
      uVar8 = 1;
      if (1 < (int)uVar6) {
        uVar8 = (ulong)uVar6;
      }
      uVar9 = 0;
      do {
        pRVar7[uVar9] = pRVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      return 0;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,
                                          REF_GEOM ref_geom_donor) {
  if (ref_geom_recipient->contex_owned)
    RSS(ref_egads_close(ref_geom_recipient), "close egads contex");

  ref_geom_recipient->contex_owned = REF_FALSE;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  ref_geom_recipient->nedge = ref_geom_donor->nedge;
  ref_geom_recipient->nface = ref_geom_donor->nface;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = ref_geom_donor->effective_curvature;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = ref_geom_donor->model;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = ref_geom_donor->faces;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = ref_geom_donor->nodes;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;

  if (NULL == ref_geom_donor->e2f) {
    ref_geom_recipient->e2f = NULL;
  } else {
    REF_INT i;
    ref_malloc(ref_geom_recipient->e2f, 2 * ref_geom_recipient->nedge, REF_INT);
    for (i = 0; i < 2 * ref_geom_recipient->nedge; i++)
      ref_geom_recipient->e2f[i] = ref_geom_donor->e2f[i];
  }

  return REF_SUCCESS;
}